

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O0

void * err_unwind(lua_State *L,void *stopcf,int errcode)

{
  int iVar1;
  uint64_t uVar2;
  TValue *top_00;
  TValue *top;
  void *pvStack_38;
  int32_t nres;
  void *cf;
  TValue *frame;
  int errcode_local;
  void *stopcf_local;
  lua_State *L_local;
  
  cf = L->base + -1;
  pvStack_38 = L->cframe;
switchD_00110da5_default:
  if (pvStack_38 == (void *)0x0) {
LAB_00110ff0:
    if (errcode != 0) {
      L->base = (TValue *)((L->stack).ptr64 + 0x10);
      L->cframe = (void *)0x0;
      unwindstack(L,L->base);
      if (*(long *)((L->glref).ptr64 + 0x160) != 0) {
        (**(code **)((L->glref).ptr64 + 0x160))(L);
      }
      exit(1);
    }
    return L;
  }
  iVar1 = *(int *)(((ulong)pvStack_38 & 0xfffffffffffffffc) + 8);
  if ((iVar1 < 0) && (top_00 = (TValue *)((L->stack).ptr64 + (long)-iVar1), cf < top_00)) {
    if (errcode != 0) {
      L->base = (TValue *)((long)cf + 8);
      L->cframe = *(void **)((long)pvStack_38 + 0x20);
      unwindstack(L,top_00);
    }
    return pvStack_38;
  }
  if (cf <= (void *)((L->stack).ptr64 + 8)) goto LAB_00110ff0;
  switch((uint)*cf & 7) {
  case 0:
  case 4:
    cf = (void *)((long)cf + (ulong)((*(uint *)(*cf + -4) >> 8 & 0xff) + 2) * -8);
    goto switchD_00110da5_default;
  case 1:
    break;
  case 2:
    if (*(long *)((long)cf + -0x18) != 1) goto switchD_00110da5_caseD_3;
    break;
  case 3:
switchD_00110da5_caseD_3:
    cf = (void *)((long)cf - (*cf & 0xfffffffffffffff8));
    goto switchD_00110da5_default;
  case 5:
    goto switchD_00110da5_caseD_5;
  case 6:
  case 7:
    if (errcode != 0) {
      if (errcode == 1) {
        cf = (void *)((long)cf - (*cf & 0xfffffffffffffff8));
        goto switchD_00110da5_default;
      }
      if ((*cf & 7) == 6) {
        uVar2 = (L->glref).ptr64;
        *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xef;
      }
      L->base = (TValue *)((long)cf + (8 - (*cf & 0xfffffffffffffff8)));
      L->cframe = pvStack_38;
      unwindstack(L,L->base);
    }
    return (void *)((ulong)pvStack_38 | 2);
  default:
    goto switchD_00110da5_default;
  }
  if (errcode == 0) {
    if (pvStack_38 != stopcf) {
      pvStack_38 = *(void **)((long)pvStack_38 + 0x20);
      cf = (void *)((long)cf - (*cf & 0xfffffffffffffff8));
      goto switchD_00110da5_default;
    }
  }
  else {
    L->base = (TValue *)((long)cf + (8 - (*cf & 0xfffffffffffffff8)));
    L->cframe = *(void **)((long)pvStack_38 + 0x20);
    unwindstack(L,(TValue *)((long)cf + -8));
  }
  return (void *)0x0;
switchD_00110da5_caseD_5:
  if (((ulong)pvStack_38 & 1) == 0) {
    if (errcode != 0) {
      L->base = (TValue *)((long)cf + (8 - (*cf & 0xfffffffffffffff8)));
      L->cframe = *(void **)((long)pvStack_38 + 0x20);
      unwindstack(L,(TValue *)((long)cf + -8));
    }
  }
  else if (errcode != 0) {
    uVar2 = (L->glref).ptr64;
    *(byte *)(uVar2 + 0x91) = *(byte *)(uVar2 + 0x91) & 0xef;
    L->cframe = (void *)0x0;
    L->status = (uint8_t)errcode;
  }
  return pvStack_38;
}

Assistant:

static void *err_unwind(lua_State *L, void *stopcf, int errcode)
{
  TValue *frame = L->base-1;
  void *cf = L->cframe;
  while (cf) {
    int32_t nres = cframe_nres(cframe_raw(cf));
    if (nres < 0) {  /* C frame without Lua frame? */
      TValue *top = restorestack(L, -nres);
      if (frame < top) {  /* Frame reached? */
	if (errcode) {
	  L->base = frame+1;
	  L->cframe = cframe_prev(cf);
	  unwindstack(L, top);
	}
	return cf;
      }
    }
    if (frame <= tvref(L->stack)+LJ_FR2)
      break;
    switch (frame_typep(frame)) {
    case FRAME_LUA:  /* Lua frame. */
    case FRAME_LUAP:
      frame = frame_prevl(frame);
      break;
    case FRAME_C:  /* C frame. */
    unwind_c:
#if LJ_UNWIND_EXT
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      } else if (cf != stopcf) {
	cf = cframe_prev(cf);
	frame = frame_prevd(frame);
	break;
      }
      return NULL;  /* Continue unwinding. */
#else
      UNUSED(stopcf);
      cf = cframe_prev(cf);
      frame = frame_prevd(frame);
      break;
#endif
    case FRAME_CP:  /* Protected C frame. */
      if (cframe_canyield(cf)) {  /* Resume? */
	if (errcode) {
	  hook_leave(G(L));  /* Assumes nobody uses coroutines inside hooks. */
	  L->cframe = NULL;
	  L->status = (uint8_t)errcode;
	}
	return cf;
      }
      if (errcode) {
	L->base = frame_prevd(frame) + 1;
	L->cframe = cframe_prev(cf);
	unwindstack(L, frame - LJ_FR2);
      }
      return cf;
    case FRAME_CONT:  /* Continuation frame. */
      if (frame_iscont_fficb(frame))
	goto unwind_c;
      /* fallthrough */
    case FRAME_VARG:  /* Vararg frame. */
      frame = frame_prevd(frame);
      break;
    case FRAME_PCALL:  /* FF pcall() frame. */
    case FRAME_PCALLH:  /* FF pcall() frame inside hook. */
      if (errcode) {
	if (errcode == LUA_YIELD) {
	  frame = frame_prevd(frame);
	  break;
	}
	if (frame_typep(frame) == FRAME_PCALL)
	  hook_leave(G(L));
	L->base = frame_prevd(frame) + 1;
	L->cframe = cf;
	unwindstack(L, L->base);
      }
      return (void *)((intptr_t)cf | CFRAME_UNWIND_FF);
    }
  }
  /* No C frame. */
  if (errcode) {
    L->base = tvref(L->stack)+1+LJ_FR2;
    L->cframe = NULL;
    unwindstack(L, L->base);
    if (G(L)->panic)
      G(L)->panic(L);
    exit(EXIT_FAILURE);
  }
  return L;  /* Anything non-NULL will do. */
}